

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse::
LocallyRedirectedRpcResponse(LocallyRedirectedRpcResponse *this,Maybe<capnp::MessageSize> *sizeHint)

{
  unsigned_long *puVar1;
  unsigned_long local_48 [4];
  Maybe<capnp::MessageSize> local_28;
  Maybe<capnp::MessageSize> *sizeHint_local;
  LocallyRedirectedRpcResponse *this_local;
  
  local_28.ptr.field_1._8_8_ = sizeHint;
  sizeHint_local = (Maybe<capnp::MessageSize> *)this;
  RpcResponse::RpcResponse(&this->super_RpcResponse);
  RpcServerResponse::RpcServerResponse(&this->super_RpcServerResponse);
  kj::Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_RpcResponse).super_ResponseHook._vptr_ResponseHook =
       (_func_int **)&PTR__LocallyRedirectedRpcResponse_00d8cda8;
  (this->super_RpcServerResponse)._vptr_RpcServerResponse = (_func_int **)&DAT_00d8cde0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_00d8cdf8;
  kj::Maybe<capnp::MessageSize>::
  map<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:2962:32)>
            (&local_28,(anon_class_1_0_00000001 *)sizeHint);
  local_48[0] = 0x400;
  puVar1 = kj::Maybe<unsigned_long>::orDefault((Maybe<unsigned_long> *)&local_28,local_48);
  MallocMessageBuilder::MallocMessageBuilder(&this->message,(uint)*puVar1,GROW_HEURISTICALLY);
  kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_28);
  return;
}

Assistant:

LocallyRedirectedRpcResponse(kj::Maybe<MessageSize> sizeHint)
        : message(sizeHint.map([](MessageSize size) { return size.wordCount; })
                          .orDefault(SUGGESTED_FIRST_SEGMENT_WORDS)) {}